

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2ModDel::renderAux2Main(V2ModDel *this,StereoSample *dest,int nsamples)

{
  ulong uVar1;
  ulong uVar2;
  float l;
  StereoSample SVar3;
  StereoSample x;
  StereoSample local_30;
  
  if ((this->wetout != 0.0) || (NAN(this->wetout))) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      l = this->inst->aux2buf[uVar2] + 3.8146973e-06;
      processSample(this,&local_30,l,l,0.0);
      SVar3._0_4_ = dest[uVar2].field_0.l + local_30.field_0.l;
      SVar3._4_4_ = dest[uVar2].field_0.r + local_30.field_0.r;
      dest[uVar2] = SVar3;
    }
  }
  return;
}

Assistant:

void renderAux2Main(StereoSample *dest, int nsamples)
    {
        if (!wetout)
            return;

        COVER("MODDEL aux->main");

        for (int i=0; i < nsamples; i++)
        {
            StereoSample x;

            float in = inst->aux2buf[i] + fcdcoffset;
            processSample(&x, in, in, 0.0f);

            dest[i].l += x.l;
            dest[i].r += x.r;
        }
    }